

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.cc
# Opt level: O2

vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *
cnn::mp::CreateWorkloads
          (vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *__return_storage_ptr__,
          uint num_children)

{
  uint __line;
  int iVar1;
  long lVar2;
  allocator_type local_21;
  
  std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::vector
            (__return_storage_ptr__,(ulong)num_children,&local_21);
  lVar2 = -0x14;
  while( true ) {
    if ((ulong)num_children * 0x14 - (lVar2 + 0x14) == 0) {
      return __return_storage_ptr__;
    }
    iVar1 = pipe((int *)((long)(__return_storage_ptr__->
                               super__Vector_base<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].p2c + lVar2));
    if (iVar1 != 0) break;
    iVar1 = pipe((int *)((long)(__return_storage_ptr__->
                               super__Vector_base<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].c2p + lVar2));
    lVar2 = lVar2 + 0x14;
    if (iVar1 != 0) {
      __line = 0x47;
LAB_0027ae95:
      __assert_fail("err == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/mp.cc"
                    ,__line,"std::vector<Workload> cnn::mp::CreateWorkloads(unsigned int)");
    }
  }
  __line = 0x45;
  goto LAB_0027ae95;
}

Assistant:

std::vector<Workload> CreateWorkloads(unsigned num_children) {
      int err;
      std::vector<Workload> workloads(num_children);
      for (unsigned cid = 0; cid < num_children; cid++) { 
        err = pipe(workloads[cid].p2c);
        assert (err == 0);
        err = pipe(workloads[cid].c2p);
        assert (err == 0);
      }
      return workloads;
    }